

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int ARGBShuffle(uint8_t *src_bgra,int src_stride_bgra,uint8_t *dst_argb,int dst_stride_argb,
               uint8_t *shuffler,int width,int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  undefined8 in_R8;
  uint in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *ARGBShuffleRow;
  int y;
  code *pcVar2;
  int local_38;
  uint local_34;
  int local_24;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  pcVar2 = ARGBShuffleRow_C;
  if ((((in_RDI == 0) || (in_RDX == 0)) || ((int)in_R9D < 1)) || ((int)ARGBShuffleRow == 0)) {
    local_4 = -1;
  }
  else {
    local_14 = in_ESI;
    local_10 = in_RDI;
    if ((int)ARGBShuffleRow < 0) {
      ARGBShuffleRow._0_4_ = -(int)ARGBShuffleRow;
      local_10 = in_RDI + ((int)ARGBShuffleRow + -1) * in_ESI;
      local_14 = -in_ESI;
    }
    local_34 = in_R9D;
    local_24 = in_ECX;
    if ((local_14 == in_R9D << 2) && (in_ECX == in_R9D << 2)) {
      local_34 = (int)ARGBShuffleRow * in_R9D;
      ARGBShuffleRow._0_4_ = 1;
      local_24 = 0;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = ARGBShuffleRow_Any_SSSE3, (local_34 & 7) == 0)) {
      pcVar2 = ARGBShuffleRow_SSSE3;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = ARGBShuffleRow_Any_AVX2, (local_34 & 0xf) == 0)) {
      pcVar2 = ARGBShuffleRow_AVX2;
    }
    local_20 = in_RDX;
    for (local_38 = 0; local_38 < (int)ARGBShuffleRow; local_38 = local_38 + 1) {
      (*pcVar2)(local_10,local_20,in_R8,local_34);
      local_10 = local_10 + local_14;
      local_20 = local_20 + local_24;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int ARGBShuffle(const uint8_t* src_bgra,
                int src_stride_bgra,
                uint8_t* dst_argb,
                int dst_stride_argb,
                const uint8_t* shuffler,
                int width,
                int height) {
  int y;
  void (*ARGBShuffleRow)(const uint8_t* src_bgra, uint8_t* dst_argb,
                         const uint8_t* shuffler, int width) = ARGBShuffleRow_C;
  if (!src_bgra || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_bgra = src_bgra + (height - 1) * src_stride_bgra;
    src_stride_bgra = -src_stride_bgra;
  }
  // Coalesce rows.
  if (src_stride_bgra == width * 4 && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_bgra = dst_stride_argb = 0;
  }
#if defined(HAS_ARGBSHUFFLEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    ARGBShuffleRow = ARGBShuffleRow_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      ARGBShuffleRow = ARGBShuffleRow_SSSE3;
    }
  }
#endif
#if defined(HAS_ARGBSHUFFLEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ARGBShuffleRow = ARGBShuffleRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      ARGBShuffleRow = ARGBShuffleRow_AVX2;
    }
  }
#endif
#if defined(HAS_ARGBSHUFFLEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBShuffleRow = ARGBShuffleRow_Any_NEON;
    if (IS_ALIGNED(width, 4)) {
      ARGBShuffleRow = ARGBShuffleRow_NEON;
    }
  }
#endif
#if defined(HAS_ARGBSHUFFLEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBShuffleRow = ARGBShuffleRow_Any_MMI;
    if (IS_ALIGNED(width, 2)) {
      ARGBShuffleRow = ARGBShuffleRow_MMI;
    }
  }
#endif
#if defined(HAS_ARGBSHUFFLEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBShuffleRow = ARGBShuffleRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      ARGBShuffleRow = ARGBShuffleRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    ARGBShuffleRow(src_bgra, dst_argb, shuffler, width);
    src_bgra += src_stride_bgra;
    dst_argb += dst_stride_argb;
  }
  return 0;
}